

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __pid_t _Var2;
  ostream *poVar3;
  AgrgumentException *this;
  streambuf *out_buf;
  string session_name;
  ArgParser args;
  History history;
  char *local_15d0;
  long local_15c8;
  char local_15c0 [16];
  char *local_15b0;
  long local_15a8;
  char local_15a0 [16];
  string local_1590;
  Configurator local_1570;
  string local_1440;
  undefined1 local_1420 [680];
  _Alloc_hider local_1178;
  size_type local_1170;
  group local_1158 [2];
  string local_10c8;
  string local_10a8 [5];
  undefined1 local_ff8 [8];
  size_type local_ff0;
  _Alloc_hider local_fd8;
  size_type local_fd0;
  undefined1 local_cc0 [16];
  char local_cb0 [3208];
  
  local_cc0._0_8_ = local_cb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cc0,"hm-db","");
  ArgParser::ArgParser((ArgParser *)local_1420,(string *)local_cc0);
  if ((char *)local_cc0._0_8_ != local_cb0) {
    operator_delete((void *)local_cc0._0_8_);
  }
  ArgParser::parse((ArgParser *)local_1420,argc,argv);
  if ((local_1420._288_4_ & ~select) == help) goto LAB_00124aba;
  if (local_1420._288_4_ == add) {
    if ((local_1420[0x230] == true) && (_Var2 = fork(), _Var2 != 0)) goto LAB_00124de9;
  }
  else {
    if (local_1420._288_4_ == configure) {
      std::ofstream::ofstream(local_cc0);
      if (local_ff0 == 0) {
        out_buf = *(streambuf **)(*(long *)(std::cerr + -0x18) + 0x214530);
      }
      else {
        std::ofstream::open((string *)local_cc0,(_Ios_Openmode)local_ff8);
        out_buf = (streambuf *)(local_cc0 + 8);
      }
      Configurator::Configurator(&local_1570,out_buf);
      local_1590._M_dataplus._M_p = (pointer)&local_1590.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1590,local_fd8._M_p,local_fd8._M_p + local_fd0);
      Configurator::configure(&local_1570,&local_1590);
      std::__cxx11::string::~string((string *)&local_1590);
LAB_00124aba:
      exit(0);
    }
    if (local_1420._288_4_ == wrapped_help) {
      paVar1 = &local_1570.configuration.field_2;
      local_1570.configuration._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1570,"hm","");
      WrappedArgsParser::WrappedArgsParser
                ((WrappedArgsParser *)local_cc0,&local_1570.configuration,local_1158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1570.configuration._M_dataplus._M_p != paVar1) {
        operator_delete(local_1570.configuration._M_dataplus._M_p);
      }
      WrappedArgsParser::print_help((WrappedArgsParser *)local_cc0);
      goto LAB_00124aba;
    }
  }
  History::History((History *)local_cc0,(string *)(local_1420 + 0x100));
  switch(local_1420._288_4_) {
  case 0:
    local_1570.configuration._M_dataplus._M_p = (pointer)&local_1570.configuration.field_2;
    if (local_1420._304_8_ == 0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1570,"notdefined","");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1570,local_1420._296_8_,
                 (pointer)(local_1420._296_8_ + local_1420._304_8_));
    }
    History::insert_sess((History *)local_cc0,&local_1570.configuration);
    std::ostream::_M_insert<long>((long)&std::cout);
    goto LAB_00124dc9;
  case 1:
    History::insert_cmd((History *)local_cc0,(string *)(local_1420 + 400),
                        (string *)(local_1420 + 0x1b0),(string *)(local_1420 + 0x1d0),
                        (string *)(local_1420 + 0x1f0),(string *)(local_1420 + 0x210));
    break;
  case 2:
    paVar1 = &local_1570.configuration.field_2;
    local_1570.configuration._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1570,local_1178._M_p,local_1178._M_p + local_1170);
    if ((local_1420[0x282] == true) && (local_1570.configuration._M_string_length == 0)) {
      History::get_sess_name(&local_1440,(History *)local_cc0,(string *)(local_1420 + 400));
      std::__cxx11::string::operator=((string *)&local_1570,(string *)&local_1440);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1440._M_dataplus._M_p != &local_1440.field_2) {
        operator_delete(local_1440._M_dataplus._M_p);
      }
    }
    History::select((History *)local_cc0,(uint)local_1420[0x280],(fd_set *)(local_1420 + 0x288),
                    (fd_set *)(ulong)local_1420[0x281],(fd_set *)(ulong)(local_1420[0x282] & 1),
                    (timeval *)&local_1570);
    if (local_1420[0x282] == true) {
      History::set_sess_name
                ((History *)local_cc0,(string *)(local_1420 + 400),&local_1570.configuration);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1570.configuration._M_dataplus._M_p == paVar1) break;
    goto LAB_00124dd7;
  case 3:
    History::parse_input_file((History *)local_cc0,&local_10c8,local_10a8);
    break;
  default:
    this = (AgrgumentException *)__cxa_allocate_exception(0x28);
    local_1570.configuration._M_dataplus._M_p = (pointer)&local_1570.configuration.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1570,"unsupported mode","");
    AgrgumentException::AgrgumentException(this,&local_1570.configuration);
    __cxa_throw(this,&AgrgumentException::typeinfo,UtilException::~UtilException);
  case 8:
    History::get_sess_name
              (&local_1570.configuration,(History *)local_cc0,(string *)(local_1420 + 400));
    local_15b0 = local_15a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_15b0,local_1420._400_8_,
               (pointer)(local_1420._400_8_ + local_1420._408_8_));
    local_15d0 = local_15c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_15d0,local_1570.configuration._M_dataplus._M_p,
               local_1570.configuration._M_dataplus._M_p + local_1570.configuration._M_string_length
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Session #",9);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_15b0,local_15a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," with name: ",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_15d0,local_15c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (local_15d0 != local_15c0) {
      operator_delete(local_15d0);
    }
    if (local_15b0 != local_15a0) {
      operator_delete(local_15b0);
    }
LAB_00124dc9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1570.configuration._M_dataplus._M_p != &local_1570.configuration.field_2) {
LAB_00124dd7:
      operator_delete(local_1570.configuration._M_dataplus._M_p);
    }
  }
  History::~History((History *)local_cc0);
LAB_00124de9:
  ArgParser::~ArgParser((ArgParser *)local_1420);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  const ArgParser args("hm-db");

  try {
    args.parse(argc, argv);

    if (args.selected == mode::help || args.selected == mode::version) {
      exit(0);
    }

    if (args.selected == mode::wrapped_help) {
      const WrappedArgsParser wrappedArgs("hm", args.select_options);
      wrappedArgs.print_help();
      exit(0);
    }

    if (args.selected == mode::configure) {
      std::ofstream file;
      std::streambuf* output = std::cerr.rdbuf();

      if (args.conffile.length()) {
        file.open(args.conffile, std::ios_base::app);
        output = file.rdbuf();
      }

      Configurator conf(output);
      conf.configure(args.hmhome);
      exit(0);
    }

    if (args.selected == mode::add && args.asynchronous) {
      if (fork() != 0) {
        return 0;
      }
    }

    History history(args.db_path);

    switch (args.selected) {
      case mode::new_session: {
        std::string session_name =
            args.session_name.length() == 0 ? "notdefined" : args.session_name;
        std::cout << history.insert_sess(session_name);
      } break;
      case mode::add:
        history.insert_cmd(args.sess_id, args.datetime, args.cwd, args.cmd,
                           args.ret_code);
        break;
      case mode::parse:
        history.parse_input_file(args.filename, args.separator);
        break;
      case mode::select: {
        std::string session_name = args.selection_session_name;

        if (args.by_sess && session_name.length() == 0)
          session_name = history.get_sess_name(args.sess_id);

        history.select(args.by_dir, args.selection_path, args.recursively,
                       args.by_sess, session_name);

        if (args.by_sess) history.set_sess_name(args.sess_id, session_name);
      } break;
      case mode::info: {
        std::string session_name = history.get_sess_name(args.sess_id);
        print_session_info(args.sess_id, session_name);
      } break;
      default:
        throw AgrgumentException("unsupported mode");
    }
  } catch (const AgrgumentException& e) {
    std::cout << "Error: " << e.what() << std::endl;
    args.print_usage();
    exit(ARG_ERROR);
  } catch (const UtilException& e) {
    std::cout << "Error: " << e.what() << std::endl;
    exit(FAILED_TO_PROCESS);
  }

  return 0;
}